

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_crosser.h
# Opt level: O0

void __thiscall S2EdgeCrosser::S2EdgeCrosser(S2EdgeCrosser *this,S2Point *a,S2Point *b)

{
  bool bVar1;
  ostream *poVar2;
  S2LogMessage local_60;
  S2LogMessageVoidify local_4d [20];
  byte local_39;
  S2LogMessage local_38;
  S2LogMessageVoidify local_21;
  S2Point *local_20;
  S2Point *b_local;
  S2Point *a_local;
  S2EdgeCrosser *this_local;
  
  this->a_ = a;
  this->b_ = b;
  local_20 = b;
  b_local = a;
  a_local = (S2Point *)this;
  Vector3<double>::CrossProd(&this->a_cross_b_,this->a_,this->b_);
  this->have_tangents_ = false;
  Vector3<double>::Vector3(&this->a_tangent_);
  Vector3<double>::Vector3(&this->b_tangent_);
  this->c_ = (S2Point *)0x0;
  bVar1 = S2::IsUnitLength(b_local);
  local_39 = 0;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_crosser.h"
               ,0xe2,kFatal,(ostream *)&std::cerr);
    local_39 = 1;
    poVar2 = S2LogMessage::stream(&local_38);
    poVar2 = std::operator<<(poVar2,"Check failed: S2::IsUnitLength(*a) ");
    S2LogMessageVoidify::operator&(&local_21,poVar2);
  }
  if ((local_39 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_38);
  }
  bVar1 = S2::IsUnitLength(local_20);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_60,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_crosser.h"
               ,0xe3,kFatal,(ostream *)&std::cerr);
    poVar2 = S2LogMessage::stream(&local_60);
    poVar2 = std::operator<<(poVar2,"Check failed: S2::IsUnitLength(*b) ");
    S2LogMessageVoidify::operator&(local_4d,poVar2);
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_60);
  }
  return;
}

Assistant:

inline S2EdgeCrosser::S2EdgeCrosser(const S2Point* a, const S2Point* b)
    : a_(a), b_(b), a_cross_b_(a_->CrossProd(*b_)), have_tangents_(false),
      c_(nullptr) {
  S2_DCHECK(S2::IsUnitLength(*a));
  S2_DCHECK(S2::IsUnitLength(*b));
}